

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_add_path(plutovg_path_t *path,plutovg_path_t *source,plutovg_matrix_t *matrix)

{
  _Bool _Var1;
  plutovg_path_command_t pVar2;
  plutovg_path_element_t *ppVar3;
  int local_68;
  int local_64;
  int local_60;
  int newcapacity_1;
  int capacity_1;
  plutovg_point_t points [3];
  undefined1 local_38 [8];
  plutovg_path_iterator_t it;
  int newcapacity;
  int capacity;
  plutovg_matrix_t *matrix_local;
  plutovg_path_t *source_local;
  plutovg_path_t *path_local;
  
  if (matrix == (plutovg_matrix_t *)0x0) {
    if (((source->elements).data != (plutovg_path_element_t *)0x0) && (0 < (source->elements).size))
    {
      if ((path->elements).capacity < (path->elements).size + (source->elements).size) {
        it.index = (path->elements).size + (source->elements).size;
        if ((path->elements).capacity == 0) {
          local_64 = 8;
        }
        else {
          local_64 = (path->elements).capacity;
        }
        for (it.size = local_64; it.size < it.index; it.size = it.size << 1) {
        }
        ppVar3 = (plutovg_path_element_t *)realloc((path->elements).data,(long)it.size << 3);
        (path->elements).data = ppVar3;
        (path->elements).capacity = it.size;
      }
      memcpy((path->elements).data + (path->elements).size,(source->elements).data,
             (long)(source->elements).size << 3);
      (path->elements).size = (source->elements).size + (path->elements).size;
    }
    path->start_point = source->start_point;
    path->num_points = source->num_points + path->num_points;
    path->num_contours = source->num_contours + path->num_contours;
    path->num_curves = source->num_curves + path->num_curves;
  }
  else {
    plutovg_path_iterator_init((plutovg_path_iterator_t *)local_38,source);
    if ((path->elements).capacity < (path->elements).size + (source->elements).size) {
      if ((path->elements).capacity == 0) {
        local_68 = 8;
      }
      else {
        local_68 = (path->elements).capacity;
      }
      for (local_60 = local_68; local_60 < (path->elements).size + (source->elements).size;
          local_60 = local_60 << 1) {
      }
      ppVar3 = (plutovg_path_element_t *)realloc((path->elements).data,(long)local_60 << 3);
      (path->elements).data = ppVar3;
      (path->elements).capacity = local_60;
    }
    while (_Var1 = plutovg_path_iterator_has_next((plutovg_path_iterator_t *)local_38), _Var1) {
      pVar2 = plutovg_path_iterator_next
                        ((plutovg_path_iterator_t *)local_38,(plutovg_point_t *)&newcapacity_1);
      switch(pVar2) {
      case PLUTOVG_PATH_COMMAND_MOVE_TO:
        plutovg_matrix_map_points
                  (matrix,(plutovg_point_t *)&newcapacity_1,(plutovg_point_t *)&newcapacity_1,1);
        plutovg_path_move_to(path,(float)newcapacity_1,(float)capacity_1);
        break;
      case PLUTOVG_PATH_COMMAND_LINE_TO:
        plutovg_matrix_map_points
                  (matrix,(plutovg_point_t *)&newcapacity_1,(plutovg_point_t *)&newcapacity_1,1);
        plutovg_path_line_to(path,(float)newcapacity_1,(float)capacity_1);
        break;
      case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        plutovg_matrix_map_points
                  (matrix,(plutovg_point_t *)&newcapacity_1,(plutovg_point_t *)&newcapacity_1,3);
        plutovg_path_cubic_to
                  (path,(float)newcapacity_1,(float)capacity_1,points[0].x,points[0].y,points[1].x,
                   points[1].y);
        break;
      case PLUTOVG_PATH_COMMAND_CLOSE:
        plutovg_path_close(path);
      }
    }
  }
  return;
}

Assistant:

void plutovg_path_add_path(plutovg_path_t* path, const plutovg_path_t* source, const plutovg_matrix_t* matrix)
{
    if(matrix == NULL) {
        plutovg_array_append(path->elements, source->elements);
        path->start_point = source->start_point;
        path->num_points += source->num_points;
        path->num_contours += source->num_contours;
        path->num_curves += source->num_curves;
        return;
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, source);

    plutovg_point_t points[3];
    plutovg_array_ensure(path->elements, source->elements.size);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_move_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_line_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            plutovg_path_cubic_to(path, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            plutovg_path_close(path);
            break;
        }
    }
}